

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O3

void __thiscall Importer_addModelToLibrary_Test::TestBody(Importer_addModelToLibrary_Test *this)

{
  shared_ptr *psVar1;
  char cVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  ModelPtr sourceModel;
  ImporterPtr importer;
  ModelPtr model;
  ParserPtr parser;
  long *local_a8;
  AssertionResult local_a0;
  long local_90 [2];
  long *local_80;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  AssertHelper local_70 [8];
  shared_ptr *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  shared_ptr *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  long local_48 [2];
  string local_38 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  undefined1 local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Parser::create(SUB81(local_28,0));
  local_58 = (shared_ptr *)local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"importer/generic_no_source.cellml","");
  fileContents((string *)&local_a0);
  libcellml::Parser::parseModel(local_38);
  if ((long *)local_a0._0_8_ != local_90) {
    operator_delete((void *)local_a0._0_8_,local_90[0] + 1);
  }
  if (local_58 != (shared_ptr *)local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  libcellml::Importer::create(SUB81(&local_58,0));
  local_a0._0_8_ = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"source","");
  libcellml::Model::create((string *)&local_68);
  if ((long *)local_a0._0_8_ != local_90) {
    operator_delete((void *)local_a0._0_8_,local_90[0] + 1);
  }
  psVar1 = local_68;
  local_a0._0_8_ = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"a","");
  libcellml::Component::create((string *)&local_80);
  libcellml::ComponentEntity::addComponent(psVar1);
  if (local_78.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.ptr_);
  }
  if ((long *)local_a0._0_8_ != local_90) {
    operator_delete((void *)local_a0._0_8_,local_90[0] + 1);
  }
  psVar1 = local_68;
  local_a0._0_8_ = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"b","");
  libcellml::Component::create((string *)&local_80);
  libcellml::ComponentEntity::addComponent(psVar1);
  if (local_78.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.ptr_);
  }
  if ((long *)local_a0._0_8_ != local_90) {
    operator_delete((void *)local_a0._0_8_,local_90[0] + 1);
  }
  psVar1 = local_68;
  local_a0._0_8_ = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"c","");
  libcellml::Component::create((string *)&local_80);
  libcellml::ComponentEntity::addComponent(psVar1);
  if (local_78.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.ptr_);
  }
  if ((long *)local_a0._0_8_ != local_90) {
    operator_delete((void *)local_a0._0_8_,local_90[0] + 1);
  }
  local_a0._0_8_ = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"d","");
  libcellml::Component::create((string *)&local_80);
  libcellml::ComponentEntity::addComponent(local_68);
  if (local_78.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.ptr_);
  }
  if ((long *)local_a0._0_8_ != local_90) {
    operator_delete((void *)local_a0._0_8_,local_90[0] + 1);
  }
  psVar1 = local_58;
  local_a0._0_8_ = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"i_dont_exist.cellml","");
  cVar2 = libcellml::Importer::addModel(psVar1,(string *)&local_68);
  local_80 = (long *)CONCAT71(local_80._1_7_,cVar2);
  local_78.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((long *)local_a0._0_8_ == local_90) {
    if (cVar2 == '\0') goto LAB_00125523;
  }
  else {
    operator_delete((void *)local_a0._0_8_,local_90[0] + 1);
    if (((ulong)local_80 & 1) == 0) {
LAB_00125523:
      testing::Message::Message((Message *)&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a0,(char *)&local_80,
                 "importer->addModel(sourceModel, \"i_dont_exist.cellml\")","false");
      testing::internal::AssertHelper::AssertHelper
                (local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
                 ,0x17d,(char *)local_a0._0_8_);
      testing::internal::AssertHelper::operator=(local_70,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(local_70);
      if ((long *)local_a0._0_8_ != local_90) {
        operator_delete((void *)local_a0._0_8_,local_90[0] + 1);
      }
      if (((local_a8 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
         (local_a8 != (long *)0x0)) {
        (**(code **)(*local_a8 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_58;
  local_a0._0_8_ = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"i_dont_exist.cellml","");
  cVar2 = libcellml::Importer::addModel(psVar1,(string *)&local_68);
  local_80 = (long *)(CONCAT71(local_80._1_7_,cVar2) ^ 1);
  local_78.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((long *)local_a0._0_8_ == local_90) {
    if (cVar2 == '\0') goto LAB_001256da;
  }
  else {
    operator_delete((void *)local_a0._0_8_,local_90[0] + 1);
    if (((ulong)local_80 & 1) != 0) goto LAB_001256da;
  }
  testing::Message::Message((Message *)&local_a8);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_a0,(char *)&local_80,"importer->addModel(sourceModel, \"i_dont_exist.cellml\")",
             "true");
  testing::internal::AssertHelper::AssertHelper
            (local_70,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
             ,0x180,(char *)local_a0._0_8_);
  testing::internal::AssertHelper::operator=(local_70,(Message *)&local_a8);
  testing::internal::AssertHelper::~AssertHelper(local_70);
  if ((long *)local_a0._0_8_ != local_90) {
    operator_delete((void *)local_a0._0_8_,local_90[0] + 1);
  }
  if (((local_a8 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
     (local_a8 != (long *)0x0)) {
    (**(code **)(*local_a8 + 8))();
  }
LAB_001256da:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_58;
  pcVar3 = "";
  local_a0._0_8_ = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"","");
  libcellml::Importer::resolveImports(psVar1,local_38);
  if ((long *)local_a0._0_8_ != local_90) {
    operator_delete((void *)local_a0._0_8_,local_90[0] + 1);
  }
  local_80 = (long *)0x0;
  local_a8 = (long *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_a0,"size_t(0)","importer->issueCount()",(unsigned_long *)&local_80,
             (unsigned_long *)&local_a8);
  if ((string)local_a0.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_a0.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((local_a0.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x184,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if (((local_80 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
       (local_80 != (long *)0x0)) {
      (**(code **)(*local_80 + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a0.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cVar2 = libcellml::Model::hasUnresolvedImports();
  local_80 = (long *)(CONCAT71(local_80._1_7_,cVar2) ^ 1);
  local_78.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar2 != '\0') {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,(char *)&local_80,"model->hasUnresolvedImports()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x185,(char *)local_a0._0_8_);
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    if ((long *)local_a0._0_8_ != local_90) {
      operator_delete((void *)local_a0._0_8_,local_90[0] + 1);
    }
    if (((local_a8 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
       (local_a8 != (long *)0x0)) {
      (**(code **)(*local_a8 + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(Importer, addModelToLibrary)
{
    // This test shows how a model instance can be manually added to the import library by the user,
    // and will be used to resolve imports, rather than from an external file/URL.
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("importer/generic_no_source.cellml"));
    auto importer = libcellml::Importer::create();

    auto sourceModel = libcellml::Model::create("source");
    sourceModel->addComponent(libcellml::Component::create("a"));
    sourceModel->addComponent(libcellml::Component::create("b"));
    sourceModel->addComponent(libcellml::Component::create("c"));
    sourceModel->addComponent(libcellml::Component::create("d"));

    // Add a model manually to the library, including the URL that it will replace in future imports.
    EXPECT_TRUE(importer->addModel(sourceModel, "i_dont_exist.cellml"));

    // Can't add to the same URL key more than once.
    EXPECT_FALSE(importer->addModel(sourceModel, "i_dont_exist.cellml"));

    importer->resolveImports(model, "");

    EXPECT_EQ(size_t(0), importer->issueCount());
    EXPECT_FALSE(model->hasUnresolvedImports());
}